

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O3

int __thiscall QOpenGLShaderProgram::link(QOpenGLShaderProgram *this,char *__from,char *__to)

{
  char *pcVar1;
  int iVar2;
  QOpenGLShaderProgramPrivate *this_00;
  long lVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  undefined1 *puVar6;
  bool bVar7;
  int iVar8;
  undefined7 extraout_var;
  undefined8 uVar9;
  void *pvVar10;
  undefined8 extraout_RAX;
  storage_type *psVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  GLint len;
  GLint value;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  undefined4 local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QOpenGLShaderProgramPrivate **)&this->field_0x8;
  if ((this_00->programGuard == (QOpenGLSharedResourceGuard *)0x0) ||
     (iVar2 = *(int *)(this_00->programGuard + 0x10), iVar2 == 0)) {
    iVar8 = 0;
  }
  else {
    lVar3 = (this_00->shaders).d.size;
    if (this_00->linkBinaryRecursion == false) {
      if (lVar3 == 0) {
        if ((this_00->binaryProgram).shaders.d.size != 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            bVar7 = QOpenGLShaderProgramPrivate::linkBinary(this_00);
            return (int)CONCAT71(extraout_var,bVar7);
          }
          goto LAB_0014d167;
        }
        goto LAB_0014cf38;
      }
      local_3c = -0x55555556;
    }
    else {
      local_3c = -0x55555556;
      if (lVar3 == 0) {
LAB_0014cf38:
        local_3c = 0;
        uVar9 = (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar2,0x8b82,&local_3c);
        this_00->linked = local_3c != 0;
        iVar8 = (int)CONCAT71((int7)((ulong)uVar9 >> 8),1);
        if (local_3c != 0) goto LAB_0014d0de;
      }
    }
    (**(code **)(*(long *)this_00->glfuncs + 0x338))(iVar2);
    local_3c = 0;
    (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar2,0x8b82,&local_3c);
    this_00->linked = local_3c != 0;
    local_3c = 0;
    uVar9 = (**(code **)(*(long *)this_00->glfuncs + 0x2a8))(iVar2,0x8b84,&local_3c);
    pQVar4 = &((this_00->log).d.d)->super_QArrayData;
    (this_00->log).d.d = (Data *)0x0;
    (this_00->log).d.ptr = (char16_t *)0x0;
    (this_00->log).d.size = 0;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        uVar9 = QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    iVar8 = local_3c;
    if (1 < (long)local_3c) {
      pvVar10 = operator_new__((long)local_3c);
      local_40 = 0xaaaaaaaa;
      (**(code **)(*(long *)this_00->glfuncs + 0x2b0))(iVar2,iVar8,&local_40,pvVar10);
      psVar11 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar11 + (long)pvVar10 + 1;
        psVar11 = psVar11 + 1;
      } while (*pcVar1 != '\0');
      QVar12.m_data = psVar11;
      QVar12.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar12);
      pQVar4 = &((this_00->log).d.d)->super_QArrayData;
      pcVar5 = (this_00->log).d.ptr;
      (this_00->log).d.d = (Data *)local_58;
      (this_00->log).d.ptr = pcStack_50;
      puVar6 = (undefined1 *)(this_00->log).d.size;
      (this_00->log).d.size = (qsizetype)local_48;
      local_58 = pQVar4;
      pcStack_50 = pcVar5;
      local_48 = puVar6;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((this_00->linked == false) && (this_00->linkBinaryRecursion == false)) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QObject::objectName();
        if (local_48 == (undefined1 *)0x0) {
          link((char *)&this_00->log,(char *)this);
        }
        else {
          link((char *)&local_58,(char *)&this_00->log);
        }
        if (local_58 != (QArrayData *)0x0) {
          LOCK();
          (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_58,2,0x10);
          }
        }
      }
      operator_delete__(pvVar10);
      uVar9 = extraout_RAX;
    }
    iVar8 = (int)CONCAT71((int7)((ulong)uVar9 >> 8),this_00->linked);
  }
LAB_0014d0de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
LAB_0014d167:
  __stack_chk_fail();
}

Assistant:

bool QOpenGLShaderProgram::link()
{
    Q_D(QOpenGLShaderProgram);
    GLuint program = d->programGuard ? d->programGuard->id() : 0;
    if (!program)
        return false;

    if (!d->linkBinaryRecursion && d->shaders.isEmpty() && !d->binaryProgram.shaders.isEmpty())
        return d->linkBinary();

    GLint value;
    if (d->shaders.isEmpty()) {
        // If there are no explicit shaders, then it is possible that the
        // application added a program binary with glProgramBinaryOES(), or
        // otherwise populated the shaders itself. This is also the case when
        // we are recursively called back from linkBinary() after a successful
        // glProgramBinary(). Check to see if the program is already linked and
        // bail out if so.
        value = 0;
        d->glfuncs->glGetProgramiv(program, GL_LINK_STATUS, &value);
        d->linked = (value != 0);
        if (d->linked)
            return true;
    }

    d->glfuncs->glLinkProgram(program);
    value = 0;
    d->glfuncs->glGetProgramiv(program, GL_LINK_STATUS, &value);
    d->linked = (value != 0);
    value = 0;
    d->glfuncs->glGetProgramiv(program, GL_INFO_LOG_LENGTH, &value);
    d->log = QString();
    if (value > 1) {
        char *logbuf = new char [value];
        GLint len;
        d->glfuncs->glGetProgramInfoLog(program, value, &len, logbuf);
        d->log = QString::fromLatin1(logbuf);
        if (!d->linked && !d->linkBinaryRecursion) {
            QString name = objectName();
            if (name.isEmpty())
                qWarning("QOpenGLShader::link: %ls", qUtf16Printable(d->log));
            else
                qWarning("QOpenGLShader::link[%ls]: %ls", qUtf16Printable(name), qUtf16Printable(d->log));
        }
        delete [] logbuf;
    }
    return d->linked;
}